

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

void cp_decl_attributes(CPState *cp,CPDecl *decl)

{
  byte *pbVar1;
  char cVar2;
  TValue *pTVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  CTSize CVar7;
  GCstr *pGVar8;
  byte bVar9;
  int iVar10;
  CPToken tok;
  GCstr *pGVar11;
  
LAB_00150563:
  do {
    switch(cp->tok) {
    case 0x118:
      pbVar1 = (byte *)((long)&decl->attr + 3);
      *pbVar1 = *pbVar1 | 2;
      break;
    case 0x119:
      pbVar1 = (byte *)((long)&decl->attr + 3);
      *pbVar1 = *pbVar1 | 1;
      break;
    case 0x11a:
    case 0x121:
    case 0x125:
      break;
    default:
      return;
    case 0x122:
      cp_next(cp);
      cp_check(cp,0x28);
      if (cp->tok == 0x101) {
        pGVar11 = cp->str;
        iVar6 = cp_next(cp);
        while (iVar6 == 0x101) {
          lj_strfmt_pushf(cp->L,"%s%s",pGVar11 + 1,cp->str + 1);
          pTVar3 = cp->L->top;
          cp->L->top = pTVar3 + -1;
          pGVar11 = (GCstr *)(pTVar3[-1].u64 & 0x7fffffffffff);
          iVar6 = cp_next(cp);
        }
        decl->redir = pGVar11;
      }
      goto LAB_0015084e;
    case 0x123:
      cp_next(cp);
      cp_check(cp,0x28);
      cp_check(cp,0x28);
      do {
        iVar6 = cp->tok;
        if (iVar6 == 0x100) {
          pGVar11 = cp->str;
          cp_next(cp);
          iVar6 = lj_cparse_case(pGVar11,
                                 "\aaligned\v__aligned__\x06packed\n__packed__\x04mode\b__mode__\vvector_size\x0f__vector_size__"
                                );
          switch(iVar6) {
          case 0:
          case 1:
            cp_decl_align(cp,decl);
            break;
          case 2:
          case 3:
            *(byte *)&decl->attr = (byte)decl->attr | 2;
            break;
          case 4:
          case 5:
            cp_check(cp,0x28);
            if (cp->tok != 0x100) goto LAB_00150785;
            pGVar11 = cp->str;
            pGVar8 = pGVar11 + 1;
            if (((char)pGVar11[1].nextgc.gcptr64 == '_') &&
               (*(char *)((long)&pGVar11[1].nextgc.gcptr64 + 1) == '_')) {
              pGVar8 = (GCstr *)((long)&pGVar11[1].nextgc.gcptr64 + 2);
            }
            iVar6 = 0;
            if ((char)(pGVar8->nextgc).gcptr64 == 'V') {
              iVar6 = *(char *)((long)&(pGVar8->nextgc).gcptr64 + 1) + -0x30;
              bVar9 = *(char *)((long)&(pGVar8->nextgc).gcptr64 + 2) - 0x30;
              if (bVar9 < 10) {
                pGVar8 = (GCstr *)((long)&(pGVar8->nextgc).gcptr64 + 3);
                iVar6 = (uint)bVar9 + iVar6 * 10;
              }
              else {
                pGVar8 = (GCstr *)((long)&(pGVar8->nextgc).gcptr64 + 2);
              }
            }
            cVar2 = (char)(pGVar8->nextgc).gcptr64;
            switch(cVar2) {
            case 'O':
              iVar10 = 0x20;
              break;
            case 'P':
            case 'R':
              goto switchD_00150705_caseD_50;
            case 'Q':
              iVar10 = 1;
              break;
            case 'S':
              iVar10 = 4;
              break;
            case 'T':
              iVar10 = 0x10;
              break;
            default:
              if (cVar2 == 'D') {
                iVar10 = 8;
              }
              else {
                if (cVar2 != 'H') goto switchD_00150705_caseD_50;
                iVar10 = 2;
              }
            }
            cVar2 = *(char *)((long)&(pGVar8->nextgc).gcptr64 + 1);
            if ((cVar2 == 'I') || (cVar2 == 'F')) {
              uVar4 = decl->attr;
              decl->attr = iVar10 << 8 | uVar4 & 0xffff00ff;
              if (iVar6 != 0) {
                uVar5 = 0x1f;
                if (iVar10 * iVar6 != 0) {
                  for (; (uint)(iVar10 * iVar6) >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                decl->attr = ((~uVar5 & 0xf) << 4 | iVar10 << 8 | uVar4 & 0xffff000f) ^ 0xf0;
              }
            }
switchD_00150705_caseD_50:
            cp_next(cp);
            goto LAB_00150785;
          case 6:
          case 7:
            CVar7 = cp_decl_sizeattr(cp);
            if (CVar7 != 0) {
              uVar4 = 0x1f;
              if (CVar7 != 0) {
                for (; CVar7 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              decl->attr = ((~uVar4 & 0xf) << 4 | decl->attr & 0xffffff0f) ^ 0xf0;
            }
            break;
          default:
            goto switchD_0015063c_default;
          }
        }
        else {
          if ((iVar6 == 0x29) || (iVar6 < 0x10d)) goto LAB_001507a6;
          cp_next(cp);
switchD_0015063c_default:
          if (cp->tok != 0x28) goto LAB_00150792;
          do {
            cp_next(cp);
            if (cp->tok == 0x103) break;
          } while (cp->tok != 0x29);
LAB_00150785:
          cp_check(cp,0x29);
        }
LAB_00150792:
        if (cp->tok != 0x2c) goto LAB_001507a6;
        cp_next(cp);
      } while( true );
    case 0x124:
      cp_next(cp);
      tok = 0x28;
      do {
        cp_check(cp,tok);
        do {
          while( true ) {
            if (cp->tok != 0x100) goto LAB_0015084e;
            pGVar11 = cp->str;
            cp_next(cp);
            if ((pGVar11->len != 5) ||
               (*(char *)((long)&pGVar11[1].nextgc.gcptr64 + 4) != 'n' ||
                (int)pGVar11[1].nextgc.gcptr64 != 0x67696c61)) break;
            cp_decl_align(cp,decl);
          }
        } while (cp->tok != 0x28);
        do {
          cp_next(cp);
          if (cp->tok == 0x103) break;
        } while (cp->tok != 0x29);
        tok = 0x29;
      } while( true );
    case 0x126:
      *(char *)((long)&decl->attr + 1) = (char)cp->ct->size;
    }
    cp_next(cp);
  } while( true );
LAB_001507a6:
  cp_check(cp,0x29);
LAB_0015084e:
  cp_check(cp,0x29);
  goto LAB_00150563;
}

Assistant:

static void cp_decl_attributes(CPState *cp, CPDecl *decl)
{
  for (;;) {
    switch (cp->tok) {
    case CTOK_CONST: decl->attr |= CTF_CONST; break;
    case CTOK_VOLATILE: decl->attr |= CTF_VOLATILE; break;
    case CTOK_RESTRICT: break;  /* Ignore. */
    case CTOK_EXTENSION: break;  /* Ignore. */
    case CTOK_ATTRIBUTE: cp_decl_gccattribute(cp, decl); continue;
    case CTOK_ASM: cp_decl_asm(cp, decl); continue;
    case CTOK_DECLSPEC: cp_decl_msvcattribute(cp, decl); continue;
    case CTOK_CCDECL:
#if LJ_TARGET_X86
      CTF_INSERT(decl->fattr, CCONV, cp->ct->size);
      decl->fattr |= CTFP_CCONV;
#endif
      break;
    case CTOK_PTRSZ:
#if LJ_64
      CTF_INSERT(decl->attr, MSIZEP, cp->ct->size);
#endif
      break;
    default: return;
    }
    cp_next(cp);
  }
}